

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

SNode * add_SNode(Parser *p,D_State *state,d_loc_t *loc,D_Scope *sc)

{
  SNode *sn;
  uint i;
  D_Scope *sc_local;
  d_loc_t *loc_local;
  D_State *state_local;
  Parser *p_local;
  
  p_local = (Parser *)find_SNode(p,(uint)(((long)state - (long)p->t->state) / 0x78),sc);
  if (p_local == (Parser *)0x0) {
    p_local = (Parser *)new_SNode(p,state,loc,sc);
    if (((D_State *)(p_local->user).free_node_fn)->shifts != 0) {
      add_Shift(p,(SNode *)p_local);
    }
    for (sn._4_4_ = 0; sn._4_4_ < (((D_State *)(p_local->user).free_node_fn)->reductions).n;
        sn._4_4_ = sn._4_4_ + 1) {
      if ((((D_State *)(p_local->user).free_node_fn)->reductions).v[sn._4_4_]->nelements == 0) {
        add_Reduction(p,(ZNode *)0x0,(SNode *)p_local,
                      (((D_State *)(p_local->user).free_node_fn)->reductions).v[sn._4_4_]);
      }
    }
  }
  return (SNode *)p_local;
}

Assistant:

static SNode *add_SNode(Parser *p, D_State *state, d_loc_t *loc, D_Scope *sc) {
  uint i;
  SNode *sn = find_SNode(p, state - p->t->state, sc);
  if (sn) return sn;
  sn = new_SNode(p, state, loc, sc);
  if (sn->state->shifts) add_Shift(p, sn);
  for (i = 0; i < sn->state->reductions.n; i++)
    if (!sn->state->reductions.v[i]->nelements) add_Reduction(p, 0, sn, sn->state->reductions.v[i]);
  return sn;
}